

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O0

int CheckExts(tchar_t *URL,tchar_t *Exts)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  tchar_t *p;
  intptr_t ExtLen;
  tchar_t *Tail;
  tchar_t Ext [256];
  char *local_20;
  tchar_t *Exts_local;
  tchar_t *URL_local;
  
  SplitPath(URL,(tchar_t *)0x0,0,(tchar_t *)0x0,0,(tchar_t *)&Tail,0x100);
  pcVar2 = strchr((char *)&Tail,0x3f);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
  }
  sVar3 = strlen((char *)&Tail);
  local_20 = Exts;
  while( true ) {
    if (local_20 == (char *)0x0) {
      return 0;
    }
    pcVar2 = strchr(local_20,0x3a);
    if (((pcVar2 != (char *)0x0) && (sVar3 == (long)pcVar2 - (long)local_20)) &&
       (iVar1 = tcsnicmp((tchar_t *)&Tail,local_20,(long)pcVar2 - (long)local_20), iVar1 == 0))
    break;
    local_20 = strchr(local_20,0x3b);
    if (local_20 != (char *)0x0) {
      local_20 = local_20 + 1;
    }
  }
  return (int)pcVar2[1];
}

Assistant:

int CheckExts(const tchar_t* URL, const tchar_t* Exts)
{
    tchar_t Ext[MAXPATH];
    tchar_t* Tail;
    intptr_t ExtLen;

    SplitPath(URL,NULL,0,NULL,0,Ext,TSIZEOF(Ext));
    Tail = tcschr(Ext,'?');
    if (Tail) *Tail = 0;
    ExtLen = tcslen(Ext);

    while (Exts)
    {
        const tchar_t* p = tcschr(Exts,':');
        if (p && (ExtLen == p-Exts) && tcsnicmp(Ext,Exts,p-Exts)==0)
            return p[1]; // return type char
        Exts = tcschr(Exts,';');
        if (Exts) ++Exts;
    }
    return 0;
}